

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  char *string;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  char cStack_49;
  char buf [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((input_number < 0.0) ||
     (((input_number == 0.0 && (!NAN(input_number))) && (1.0 / input_number < 0.0)))) {
    putchar(0x2d);
    input_number = -input_number;
  }
  if ((input_number != 0.0) || (NAN(input_number))) {
    if (NAN(input_number)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        string = "nan";
        goto LAB_001060d2;
      }
    }
    else if (ABS(input_number) == INFINITY) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        string = "inf";
        goto LAB_001060d2;
      }
    }
    else {
      iVar9 = 0;
      for (; input_number < 0.10000000149011612; input_number = input_number * 1000000.0) {
        iVar9 = iVar9 + -6;
      }
      for (; input_number < 100000.0; input_number = input_number * 10.0) {
        iVar9 = iVar9 + -1;
      }
      for (; 999999995904.0 < input_number; input_number = input_number / 1000000.0) {
        iVar9 = iVar9 + 6;
      }
      for (; 1000000.0 < input_number; input_number = input_number / 10.0) {
        iVar9 = iVar9 + 1;
      }
      iVar4 = (int)(input_number + input_number);
      uVar2 = (uint)(0x1e847e < iVar4);
      uVar5 = 100000;
      if (iVar4 < 1999999) {
        uVar5 = (long)(iVar4 + 1) / 2 & 0xffffffff;
      }
      uVar7 = 5;
      uVar3 = uVar7;
      if (uVar2 + iVar9 + 9 < 10) {
        uVar7 = (ulong)-(uVar2 + iVar9);
        uVar3 = uVar7;
      }
      while( true ) {
        if (((int)uVar7 < 1) || ((int)uVar5 % 10 != 0)) break;
        uVar7 = uVar7 - 1;
        uVar5 = (long)(int)uVar5 / 10 & 0xffffffff;
      }
      for (uVar10 = 0; (iVar4 = (int)uVar5, iVar4 != 0 || ((long)uVar10 <= (long)(int)uVar7));
          uVar10 = uVar10 + 1) {
        buf[uVar10] = (char)(iVar4 % 10) + '0';
        uVar5 = (long)iVar4 / 10 & 0xffffffff;
      }
      lVar8 = uVar7 - uVar10;
      while (0 < (long)uVar10) {
        if (lVar8 == 0) {
          putchar(0x2e);
        }
        uVar10 = uVar10 - 1;
        putchar((int)buf[uVar10 & 0xffffffff]);
        lVar8 = lVar8 + 1;
      }
      uVar6 = (int)uVar3 + uVar2 + iVar9;
      if (uVar6 != 0) {
        putchar(0x65);
        if ((int)uVar6 < 0) {
          putchar(0x2d);
          uVar6 = -((int)uVar3 + uVar2 + iVar9);
        }
        else {
          putchar(0x2b);
        }
        for (uVar5 = 0; uVar5 < 2 || uVar6 != 0; uVar5 = uVar5 + 1) {
          uVar3 = (ulong)uVar6;
          uVar6 = uVar6 / 10;
          buf[uVar5] = (byte)(uVar3 % 10) | 0x30;
        }
        for (; 0 < (long)uVar5; uVar5 = uVar5 - 1) {
          putchar((int)buf[uVar5 - 1]);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    string = "0";
LAB_001060d2:
    UnityPrint(string);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
    UNITY_DOUBLE number = input_number;

    /* print minus sign (including for negative zero) */
    if (number < (double)0.0f || (number == (double)0.0f && (double)1.0f / number < (double)0.0f))
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == (double)0.0f) UnityPrint("0");
    else if (isnan(number)) UnityPrint("nan");
    else if (isinf(number)) UnityPrint("inf");
    else
    {
        int exponent = 0;
        int decimals, digits;
        UNITY_INT32 n;
        char buf[16];

        /* scale up or down by powers of 10 */
        while (number < (double)(100000.0f / 1e6f))  { number *= (double)1e6f; exponent -= 6; }
        while (number < (double)100000.0f)         { number *= (double)10.0f; exponent--; }
        while (number > (double)(1000000.0f * 1e6f)) { number /= (double)1e6f; exponent += 6; }
        while (number > (double)1000000.0f)        { number /= (double)10.0f; exponent++; }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;
        if (n > 999999)
        {
            n = 100000;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = (exponent <= 0 && exponent >= -9) ? -exponent : 5;
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while (decimals > 0 && n % 10 == 0)
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while (n != 0 || digits < decimals + 1)
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if(digits == decimals) UNITY_OUTPUT_CHAR('.');
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if(exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while (exponent != 0 || digits < 2)
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}